

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_normalize_mxz(mbedtls_ecp_group *grp,mbedtls_ecp_point *P)

{
  int local_1c;
  int ret;
  mbedtls_ecp_point *P_local;
  mbedtls_ecp_group *grp_local;
  
  local_1c = mbedtls_mpi_inv_mod(&P->Z,&P->Z,&grp->P);
  if (((local_1c == 0) && (local_1c = mbedtls_mpi_mul_mpi(&P->X,&P->X,&P->Z), local_1c == 0)) &&
     (local_1c = ecp_modp(&P->X,grp), local_1c == 0)) {
    mul_count = mul_count + 1;
    local_1c = mbedtls_mpi_lset(&P->Z,1);
  }
  return local_1c;
}

Assistant:

static int ecp_normalize_mxz( const mbedtls_ecp_group *grp, mbedtls_ecp_point *P )
{
    int ret;

    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &P->Z, &P->Z, &grp->P ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &P->X, &P->X, &P->Z ) ); MOD_MUL( P->X );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &P->Z, 1 ) );

cleanup:
    return( ret );
}